

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lupica.c
# Opt level: O2

void print_instr(Emulator *e,Instr instr,_Bool print_memory)

{
  InstrFormat IVar1;
  char *pcVar2;
  char cVar3;
  u16 uVar4;
  int iVar5;
  long lVar6;
  anon_union_4_2_94730066_for_Instr_4 addr;
  int iVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  char *__s;
  anon_union_4_2_94730066_for_Instr_4 aVar11;
  ulong uVar12;
  char *__s_00;
  char buf [100];
  
  addr = instr.field_4;
  uVar10 = instr._0_8_;
  uVar12 = uVar10 & 0xffffffff;
  IVar1 = s_op_info[uVar12].format;
  pcVar2 = s_op_info[uVar12].fmt_str;
  iVar7 = 0;
  __s_00 = buf;
  iVar5 = snprintf(__s_00,100,"\x1b[32m%s\x1b[37m ",s_op_info[uVar12].op_str);
  iVar8 = 0;
  if (10 < IVar1 - FORMAT_M) goto LAB_00103757;
  uVar12 = uVar10 >> 0x28;
  lVar6 = (long)iVar5;
  __s = buf + lVar6;
  uVar9 = instr._4_4_;
  iVar8 = iVar7;
  switch(IVar1) {
  case FORMAT_M:
    break;
  case FORMAT_N:
    uVar12 = uVar10 >> 0x20;
    break;
  case FORMAT_NM:
    aVar11.d = uVar9 >> 8 & 0xff;
    uVar12 = (ulong)(uVar9 & 0xff);
    goto LAB_00103715;
  case FORMAT_MD:
    goto LAB_0010370b;
  default:
    uVar12 = uVar10 >> 0x20;
LAB_0010370b:
    uVar12 = uVar12 & 0xff;
    aVar11.d = addr.d;
LAB_00103715:
    snprintf(__s,100 - lVar6,pcVar2,(ulong)aVar11.d,uVar12);
    goto LAB_00103757;
  case FORMAT_NMD:
    snprintf(__s,100 - lVar6,pcVar2,(ulong)(uVar9 >> 8 & 0xff),(ulong)addr.d,(ulong)(uVar9 & 0xff));
    goto LAB_00103757;
  case FORMAT_D:
  case FORMAT_D12:
  case FORMAT_I:
    uVar12 = (ulong)addr.d;
    goto LAB_00103734;
  }
  uVar12 = uVar12 & 0xff;
LAB_00103734:
  snprintf(__s,100 - lVar6,pcVar2,uVar12);
LAB_00103757:
  do {
    cVar3 = *__s_00;
    if (cVar3 == '\x1b') {
      while ((cVar3 != '\0' && (cVar3 != 'm'))) {
        pcVar2 = __s_00 + 1;
        __s_00 = __s_00 + 1;
        cVar3 = *pcVar2;
      }
    }
    else {
      if (cVar3 == '\0') {
        printf("%s%*s",buf,(ulong)(0x1e - iVar8),"");
        if (print_memory) {
          if ((IVar1 == FORMAT_ND8) || (instr.op == MOVA_A_D_PC_R0 && IVar1 == FORMAT_D)) {
            if (instr.op == MOVW_A_D_PC_RN) {
              uVar4 = read_u16(e,addr.d);
              uVar9 = (uint)(short)uVar4;
            }
            else {
              uVar9 = read_u32(e,addr.d);
            }
            printf("; 0x%08x",(ulong)uVar9);
          }
        }
        return;
      }
      iVar8 = iVar8 + 1;
    }
    __s_00 = __s_00 + 1;
  } while( true );
}

Assistant:

void print_instr(Emulator* e, Instr instr, bool print_memory) {
  char buf[100];
  char* bufp = buf;

#define SNCAT(...) \
  bufp += snprintf(bufp, sizeof(buf) - (bufp - buf), __VA_ARGS__)

  OpInfo op_info = s_op_info[instr.op];
  SNCAT(GREEN "%s" WHITE " ", op_info.op_str);

  // clang-format off
  switch (op_info.format) {
    case FORMAT_0: break;
    case FORMAT_M: SNCAT(op_info.fmt_str, instr.m); break;
    case FORMAT_N: SNCAT(op_info.fmt_str, instr.n); break;
    case FORMAT_NM: SNCAT(op_info.fmt_str, instr.m, instr.n); break;
    case FORMAT_MD: SNCAT(op_info.fmt_str, instr.d, instr.m); break;
    case FORMAT_NMD: SNCAT(op_info.fmt_str, instr.m, instr.d, instr.n); break;
    case FORMAT_D:
    case FORMAT_D12: SNCAT(op_info.fmt_str, instr.d); break;
    case FORMAT_ND4:
    case FORMAT_ND8: SNCAT(op_info.fmt_str, instr.d, instr.n); break;
    case FORMAT_I: SNCAT(op_info.fmt_str, instr.i); break;
    case FORMAT_NI: SNCAT(op_info.fmt_str, instr.i, instr.n); break;
  }
  // clang-format on

#undef SNCAT

  /* Count the length of the instruction, skipping color escape codes. */
  int count = 0;
  const char* p;
  for (p = buf; *p; ++p) {
    if (*p == '\x1b') {
      while (*p && *p != 'm') p++;
    } else {
      ++count;
    }
  }

  /* Pad out the instruction with spaces, so whatever follows is aligned. */
  printf("%s%*s", buf, INSTR_COLUMNS - count, "");

  if (print_memory) {
    if ((op_info.format == FORMAT_D && instr.op == MOVA_A_D_PC_R0) ||
        (op_info.format == FORMAT_ND8)) {
      /* PC relative memory access */
      u32 val;
      if (instr.op == MOVW_A_D_PC_RN) {
        val = SIGN_EXTEND(read_u16(e, instr.d), 16);
      } else {
        val = read_u32(e, instr.d);
      }
      printf("; 0x%08x", val);
    }
  }
}